

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Amiga::Chipset::DiskDMA::enqueue(DiskDMA *this,uint16_t value,bool matches_sync)

{
  reference pvVar1;
  bool matches_sync_local;
  uint16_t value_local;
  DiskDMA *this_local;
  
  if ((matches_sync) && (this->state_ == WaitingForSync)) {
    this->state_ = Reading;
  }
  else if (this->state_ == Reading) {
    pvVar1 = std::array<unsigned_short,_4UL>::operator[](&this->buffer_,this->buffer_write_ & 3);
    *pvVar1 = value;
    if (this->buffer_write_ == this->buffer_read_ + 4) {
      this->buffer_read_ = this->buffer_read_ + 1;
    }
    this->buffer_write_ = this->buffer_write_ + 1;
  }
  return;
}

Assistant:

void Chipset::DiskDMA::enqueue(uint16_t value, bool matches_sync) {
	if(matches_sync && state_ == State::WaitingForSync) {
		state_ = State::Reading;
		return;
	}

	if(state_ == State::Reading) {
		buffer_[buffer_write_ & 3] = value;
		if(buffer_write_ == buffer_read_ + 4) {
			++buffer_read_;
		}
		++buffer_write_;
	}
}